

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O3

void interpolative_internal::decode_interpolative
               (bit_stream *is,uint32_t *out_buf,size_t n,size_t low,size_t high)

{
  long lVar1;
  size_t high_00;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  if (n != 0) {
    do {
      uVar7 = 0;
      uVar5 = 1;
      uVar4 = n + 1 >> 1;
      lVar1 = (uVar4 - 1) + low;
      n = n - uVar4;
      lVar2 = high - (n + lVar1);
      uVar6 = lVar2 + 1;
      if (lVar2 != 0) {
        lVar8 = 1L << ((ulong)(byte)-(char)LZCOUNT(lVar2) & 0x3f);
        uVar7 = uVar6 * 2 - lVar8;
        uVar9 = lVar8 - uVar6;
        uVar3 = bit_stream::get_int(is,LZCOUNT(lVar2) ^ 0x3f);
        uVar5 = uVar3 + 1;
        if (uVar9 < uVar5) {
          uVar3 = bit_stream::get_int(is,1);
          uVar5 = ~uVar9 + uVar5 * 2 + uVar3;
        }
      }
      uVar5 = (uVar7 >> 1) + uVar5;
      if (uVar5 <= uVar6) {
        uVar6 = 0;
      }
      lVar2 = uVar5 - uVar6;
      high_00 = lVar1 + -2 + lVar2;
      out_buf[uVar4 - 1] = (uint32_t)high_00;
      if (uVar4 - 1 != 0) {
        decode_interpolative(is,out_buf,uVar4 - 1,low,high_00);
      }
      out_buf = out_buf + uVar4;
      low = lVar2 + lVar1;
    } while (n != 0);
  }
  return;
}

Assistant:

static inline void decode_interpolative(
        bit_stream& is, uint32_t* out_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = low + n1 - 1ULL
            + read_center_mid(is, high - n2 - low - n1 + 1ULL);

        out_buf[h - 1] = v - 1; // we don't encode 0
        if (n1)
            decode_interpolative(is, out_buf, n1, low, v - 1ULL);
        if (n2)
            decode_interpolative(is, out_buf + h, n2, v + 1ULL, high);
    }